

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.h
# Opt level: O2

void __thiscall ExpressionEvalContext::~ExpressionEvalContext(ExpressionEvalContext *this)

{
  SmallArray<ExprPointerLiteral_*,_32U>::~SmallArray(&this->abandonedMemory);
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::~SmallArray(&this->stackFrames);
  return;
}

Assistant:

ExpressionEvalContext(ExpressionContext &ctx, Allocator *allocator): ctx(ctx), stackFrames(allocator), abandonedMemory(allocator)
	{
		errorBuf = 0;
		errorBufSize = 0;
		errorCritical = false;

		globalFrame = 0;

		emulateKnownExternals = false;

		stackDepthLimit = 64;

		variableMemoryLimit = 8 * 1024;

		totalMemory = 0;
		totalMemoryLimit = 64 * 1024;

		instruction = 0;
		instructionsLimit = 64 * 1024;

		expressionDepth = 0;
		expressionDepthLimit = 2048;
	}